

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O3

void __thiscall ProjectBuilderSubDirs::~ProjectBuilderSubDirs(ProjectBuilderSubDirs *this)

{
  QMakeProject *this_00;
  Data *pDVar1;
  
  if (this->autoDelete == true) {
    this_00 = this->project;
    if (this_00 != (QMakeProject *)0x0) {
      pDVar1 = (this_00->m_projectDir).d.d;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar1->super_QArrayData).ref_._q_value + -1);
        UNLOCK();
        if ((__atomic_base<int>)*(__int_type *)&(pDVar1->super_QArrayData).ref_._q_value ==
            (__atomic_base<int>)0x0) {
          QArrayData::deallocate(&((this_00->m_projectDir).d.d)->super_QArrayData,2,0x10);
        }
      }
      pDVar1 = (this_00->m_projectFile).d.d;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
        UNLOCK();
        if ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
          QArrayData::deallocate(&((this_00->m_projectFile).d.d)->super_QArrayData,2,0x10);
        }
      }
      QMakeEvaluator::~QMakeEvaluator(&this_00->super_QMakeEvaluator);
    }
    operator_delete(this_00,0x2e0);
  }
  pDVar1 = (this->subdir).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->subdir).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

~ProjectBuilderSubDirs() {
        if(autoDelete)
            delete project;
    }